

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_func_queue_examples.cpp
# Opt level: O3

void density_tests::
     SpFunctionQueueSamples<(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0>
     ::func_queue_put_samples(ostream *i_ostream)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  long lVar4;
  undefined8 *puVar5;
  void *pvVar6;
  int iVar7;
  Struct struct_instance;
  type return_value;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  queue;
  anon_class_8_1_90f47376 func;
  PrintScopeDuration dur;
  undefined1 local_180 [24];
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  *local_168;
  undefined1 local_158 [16];
  atomic<density::detail::LfQueueControl_*> local_148;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  local_140;
  anon_class_8_1_90f47376 local_a8;
  PrintScopeDuration local_a0 [2];
  
  PrintScopeDuration::PrintScopeDuration
            (local_a0,i_ostream,"spin-locking function queue put samples");
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::
  emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::_lambda()_1_,density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::_lambda()_1_>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_140,(anon_class_1_0_00000001 *)local_180);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::
  emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::_lambda()_2_,density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::_lambda()_2_>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_140,(anon_class_1_0_00000001 *)local_180);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::
  emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::_lambda()_3_,density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::_lambda()_3_>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_140,(anon_class_1_0_00000001 *)local_180);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::
  emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::_lambda()_4_,density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::_lambda()_4_>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_140,(anon_class_1_0_00000001 *)local_180);
  do {
    bVar1 = density::
            sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
            ::try_consume_impl(&local_140);
  } while (bVar1);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue(&local_140.m_queue);
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  LOCK();
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p =
       (__base_type)
       ((ulong)local_140.m_queue.
               super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
               .
               super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
               .m_initial_page._M_b._M_p & 0xffffffffffffff00);
  UNLOCK();
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ._16_8_ = 0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  local_180._0_8_ = func_queue_put_samples::Struct::func_1;
  local_180._8_8_ = (__pointer_type)0x0;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  emplace<int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct::*)(),int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_140,(offset_in_Struct_to_subr *)local_180);
  local_180._0_8_ = func_queue_put_samples::Struct::func_2;
  local_180._8_8_ = (__pointer_type)0x0;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  emplace<int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct::*)(),int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_140,(offset_in_Struct_to_subr *)local_180);
  local_180._0_8_ = (LfQueueControl *)0x0;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  emplace<int_density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct::*,int_density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct::*>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_140,(offset_in_Struct_to_int *)local_180);
  local_180._0_8_ = (LfQueueControl *)0x4;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  emplace<int_density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct::*,int_density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct::*>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_140,(offset_in_Struct_to_int *)local_180);
  local_180._0_8_ = (LfQueueControl *)0x400000003;
  iVar7 = 0;
  while( true ) {
    density::
    sp_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::try_consume_impl((sp_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                        *)local_158,&local_140,local_180);
    if (local_158[4] == '\0') break;
    iVar7 = iVar7 + local_158._0_4_;
  }
  if (iVar7 != 10) {
    __assert_fail("sum == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                  ,0x58,
                  "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_single>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single]"
                 );
  }
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)&local_140);
  local_158._0_8_ = (LfQueueControl *)0x3ff0000000000000;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  iVar7 = 10;
  local_a8.last_val = (double *)local_158;
  do {
    density::
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,double()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
    ::
    emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::_lambda()_5_,density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::_lambda()_5_&>
              ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,double()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
                *)&local_140,&local_a8);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  while( true ) {
    density::
    sp_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::try_consume_impl((sp_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                        *)local_180,&local_140);
    if (local_180[8] == '\0') break;
    poVar2 = std::ostream::_M_insert<double>((double)local_180._0_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_140);
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  local_180._0_4_ = 7;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::
  emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0>::func_queue_put_samples(std::ostream&)::Func,int>
            ((sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_140,(int *)local_180);
  bVar1 = density::
          sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
          ::try_consume_impl(&local_140);
  if (bVar1) {
    density::
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::~sp_heter_queue(&local_140.m_queue);
    local_140.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_tail = 0xffc0;
    local_140.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_140.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
    .m_head = (ControlBlock *)0x0;
    density::detail::
    LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,16ul,8ul>
              ((Allocation *)local_158,&local_140);
    ((LfQueueControl *)(local_158._0_8_ + 8))->m_next =
         (uintptr_t)
         density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>::
         Impl<Func>::align_invoke_destroy;
    ((LfQueueControl *)(local_158._0_8_ + 0x10))->m_next =
         (uintptr_t)
         density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>::
         Impl<Func>::align_destroy;
    *(uintptr_t *)local_148._M_b._M_p = 0;
    ((__pointer_type)((long)local_148._M_b._M_p + 8))->m_next = 0;
    local_180._0_8_ = local_158._0_8_;
    local_180._8_8_ = local_158._8_8_;
    local_180._16_8_ = local_148._M_b._M_p;
    local_168 = &local_140;
    pvVar3 = density::
             sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
             ::put_transaction<Func>::raw_allocate((put_transaction<Func> *)local_180,0xc,1);
    lVar4 = 0;
    do {
      *(char *)((long)pvVar3 + lVar4) = "Hello world"[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xc);
    puVar5 = (undefined8 *)
             density::
             sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
             ::put_transaction<Func>::element_ptr((put_transaction<Func> *)local_180);
    *puVar5 = pvVar3;
    pvVar3 = density::
             sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
             ::put_transaction<Func>::raw_allocate((put_transaction<Func> *)local_180,0x12,1);
    lVar4 = 0;
    do {
      *(char *)((long)pvVar3 + lVar4) = "\t(I\'m so happy)!!"[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x12);
    pvVar6 = density::
             sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
             ::put_transaction<Func>::element_ptr((put_transaction<Func> *)local_180);
    *(void **)((long)pvVar6 + 8) = pvVar3;
    density::
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<Func>::commit((put_transaction<Func> *)local_180);
    bVar1 = density::
            sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
            ::try_consume_impl(&local_140);
    if (bVar1) {
      if ((__pointer_type)local_180._16_8_ != (__pointer_type)0x0) {
        density::detail::
        LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
        ::cancel_put_impl((Allocation *)local_180);
      }
      density::
      sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::~sp_heter_queue(&local_140.m_queue);
      local_140.m_queue.
      super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
      .
      super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      .m_tail = 0xffc0;
      local_140.m_queue.
      super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
      .
      super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
      .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_140.m_queue.
      super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
      .m_head = (ControlBlock *)0x0;
      density::detail::
      LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::consistency_model)1>
      ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,16ul,8ul>
                ((Allocation *)local_158,&local_140);
      ((LfQueueControl *)(local_158._0_8_ + 8))->m_next =
           (uintptr_t)
           density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>::
           Impl<Func>::align_invoke_destroy;
      ((LfQueueControl *)(local_158._0_8_ + 0x10))->m_next =
           (uintptr_t)
           density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>::
           Impl<Func>::align_destroy;
      *(uintptr_t *)local_148._M_b._M_p = 0;
      ((__pointer_type)((long)local_148._M_b._M_p + 8))->m_next = 0;
      local_180._0_8_ = local_158._0_8_;
      local_180._8_8_ = local_158._8_8_;
      local_180._16_8_ = local_148._M_b._M_p;
      local_168 = &local_140;
      pvVar3 = density::
               sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
               ::put_transaction<Func>::raw_allocate((put_transaction<Func> *)local_180,0xc,1);
      lVar4 = 0;
      do {
        *(char *)((long)pvVar3 + lVar4) = "Hello world"[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xc);
      puVar5 = (undefined8 *)
               density::
               sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
               ::put_transaction<Func>::element_ptr((put_transaction<Func> *)local_180);
      *puVar5 = pvVar3;
      pvVar3 = density::
               sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
               ::put_transaction<Func>::raw_allocate((put_transaction<Func> *)local_180,0x12,1);
      lVar4 = 0;
      do {
        *(char *)((long)pvVar3 + lVar4) = "\t(I\'m so happy)!!"[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x12);
      pvVar6 = density::
               sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
               ::put_transaction<Func>::element_ptr((put_transaction<Func> *)local_180);
      *(void **)((long)pvVar6 + 8) = pvVar3;
      density::
      sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::put_transaction<Func>::commit((put_transaction<Func> *)local_180);
      bVar1 = density::
              sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
              ::try_consume_impl(&local_140);
      if (bVar1) {
        if ((__pointer_type)local_180._16_8_ != (__pointer_type)0x0) {
          density::detail::
          LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::cancel_put_impl((Allocation *)local_180);
        }
        density::
        sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
        ::~sp_heter_queue(&local_140.m_queue);
        PrintScopeDuration::~PrintScopeDuration(local_a0);
        return;
      }
      __assert_fail("invoked",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                    ,0xda,
                    "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_single>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single]"
                   );
    }
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                  ,0xb7,
                  "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_single>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single]"
                 );
  }
  __assert_fail("invoked",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                ,0x94,
                "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_single>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_single]"
               );
}

Assistant:

static void func_queue_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "spin-locking function queue put samples");

            using namespace density;

            {
                //! [sp_function_queue push example 1]
                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                queue.push([] { std::cout << "Hello"; });
                queue.push([] { std::cout << " world"; });
                queue.push([] { std::cout << "!!!"; });
                queue.push([] { std::cout << std::endl; });
                while (queue.try_consume())
                    ;
                //! [sp_function_queue push example 1]
            }
            {
                //! [sp_function_queue push example 3]
#if !defined(_MSC_VER) || !defined(_M_X64) /* the size of a type must always be a multiple of
        the alignment, but in the Microsoft's compiler, on 64-bit targets, pointers to data
        member are 4 bytes big, but are aligned to 8 bytes.

        Test code:
            using T = int Struct::*;
            std::cout << sizeof(T) << std::endl;
            std::cout << alignof(T) << std::endl;
        */

                struct Struct
                {
                    int func_1() { return 1; }
                    int func_2() { return 2; }
                    int var_1 = 3;
                    int var_2 = 4;
                };

                sp_function_queue<int(Struct *)> queue;
                queue.push(&Struct::func_1);
                queue.push(&Struct::func_2);
                queue.push(&Struct::var_1);
                queue.push(&Struct::var_2);

                Struct struct_instance;

                int sum = 0;
                while (auto const return_value = queue.try_consume(&struct_instance))
                    sum += *return_value;
                assert(sum == 10);

#endif
//! [sp_function_queue push example 3]
#if !defined(_MSC_VER) || !defined(_M_X64)
                (void)sum;
#endif
            }
            {
                //! [sp_function_queue push example 2]
                double last_val = 1.;

                auto func = [&last_val] { return last_val /= 2.; };

                sp_function_queue<
                  double(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                for (int i = 0; i < 10; i++)
                    queue.push(func);

                while (auto const return_value = queue.try_consume())
                    std::cout << *return_value << std::endl;
                //! [sp_function_queue push example 2]
            }
            {
                //! [sp_function_queue emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                queue.template emplace<Func>(7);

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [sp_function_queue emplace example 1]
                (void)invoked;
            }
            {
                //! [sp_function_queue start_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                     queue;
                auto transaction = queue.start_push(Func{});

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [sp_function_queue start_push example 1]
                (void)invoked;
            }
            {
                //! [sp_function_queue start_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                     queue;
                auto transaction = queue.template start_emplace<Func>();

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [sp_function_queue start_emplace example 1]
                (void)invoked;
            }
        }